

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

DataBlobSourceDescription * __thiscall
hrgls::datablob::DataBlobSource::GetInfo
          (DataBlobSourceDescription *__return_storage_ptr__,DataBlobSource *this)

{
  hrgls_DataBlobSource phVar1;
  DataBlobSource_private *pDVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  char *name;
  hrgls_APIDataBlobSourceInfo info;
  DataBlobSourceDescription ret;
  key_type local_80;
  key_type local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48 [32];
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  if ((this->m_private == (DataBlobSource_private *)0x0) ||
     (phVar1 = this->m_private->m_stream, phVar1 == (hrgls_DataBlobSource)0x0)) {
LAB_00104f2c:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_68);
  }
  else {
    iVar3 = hrgls_DataBlobSourceGetInfo(phVar1,&local_70);
    pDVar2 = this->m_private;
    pcVar4 = (char *)pthread_self();
    local_80._M_thread = (native_handle_type)pcVar4;
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar2->m_status,&local_80);
    *pmVar5 = iVar3;
    if (iVar3 == 0) {
      iVar3 = hrgls_APIDataBlobSourceGetName(local_70,&local_80);
      local_78._M_thread = (native_handle_type)pcVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_78);
      *pmVar5 = iVar3;
      if (iVar3 == 0) {
        std::__cxx11::string::string(local_48,(char *)local_80._M_thread,(allocator *)&local_78);
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::~string(local_48);
        goto LAB_00104f2c;
      }
    }
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

::std::vector<DataBlobSourceDescription> API::GetAvailableDataBlobSources() const
  {
    ::std::vector<DataBlobSourceDescription> ret;
    if (!m_private) {
      return ret;
    }

    // Find out how many DataBlobSources are in the system, which will also latch the data.
    uint32_t count;
    if (hrgls_STATUS_OKAY !=
      (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceCount(m_private->m_api, &count))) {
      return ret;
    }

    // Read each DataBlobSource's information and fill it into information to be returned.
    for (uint32_t i = 0; i < count; i++) {
      hrgls_APIDataBlobSourceInfo info;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetAvailableDataBlobSourceInfo(m_private->m_api,
          i, &info))) {
        ret.clear();
        return ret;
      }

      // Get and fill in the name.
      const char *name;
      if (hrgls_STATUS_OKAY !=
        (m_private->m_status[std::this_thread::get_id()] = hrgls_APIDataBlobSourceGetName(info, &name))) {
        ret.clear();
        return ret;
      }

      DataBlobSourceDescription ri;
      ri.Name(name);

      ret.push_back(ri);
    }

    return ret;
  }